

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlCtxtErrMemory(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  long lVar2;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  long lStack_8;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,1,
                        (xmlError *)0x0);
    return;
  }
  ctxt->errNo = 2;
  ctxt->instate = XML_PARSER_EOF;
  ctxt->wellFormed = 0;
  ctxt->disableSAX = 2;
  schannel = ctxt->errorHandler;
  if (schannel == (xmlStructuredErrorFunc)0x0) {
    p_Var1 = ctxt->sax;
    lStack_8 = 8;
    lVar2 = 8;
    if ((p_Var1->initialized != 0xdeedbeaf) ||
       (schannel = p_Var1->serror, schannel == (xmlStructuredErrorFunc)0x0)) {
      channel = p_Var1->error;
      schannel = (xmlStructuredErrorFunc)0x0;
      goto LAB_0014202f;
    }
  }
  else {
    lStack_8 = 800;
  }
  channel = (xmlGenericErrorFunc)0x0;
  lVar2 = lStack_8;
LAB_0014202f:
  xmlRaiseMemoryError(schannel,channel,*(void **)((long)&ctxt->sax + lVar2),1,&ctxt->lastError);
  return;
}

Assistant:

void
xmlCtxtErrMemory(xmlParserCtxtPtr ctxt)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data;

    if (ctxt == NULL) {
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_PARSER, NULL);
        return;
    }

    ctxt->errNo = XML_ERR_NO_MEMORY;
    ctxt->instate = XML_PARSER_EOF; /* TODO: Remove after refactoring */
    ctxt->wellFormed = 0;
    ctxt->disableSAX = 2;

    if (ctxt->errorHandler) {
        schannel = ctxt->errorHandler;
        data = ctxt->errorCtxt;
    } else if ((ctxt->sax->initialized == XML_SAX2_MAGIC) &&
        (ctxt->sax->serror != NULL)) {
        schannel = ctxt->sax->serror;
        data = ctxt->userData;
    } else {
        channel = ctxt->sax->error;
        data = ctxt->userData;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_PARSER,
                        &ctxt->lastError);
}